

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall bpwriter::format_char(bpwriter *this,vm_val_t *val)

{
  wchar_t ch;
  short *psVar1;
  
  psVar1 = (short *)vm_val_t::get_as_string(val);
  if (psVar1 == (short *)0x0) {
    ch = vm_val_t::cast_to_int(val);
    if (0xffff < (uint)ch) {
      err_throw(0x7e7);
    }
  }
  else {
    if (*psVar1 == 0) {
      putch(this,'\0');
      return;
    }
    ch = utf8_ptr::s_getch((char *)(psVar1 + 1));
  }
  putwch(this,ch);
  return;
}

Assistant:

void format_char(VMG_ const vm_val_t *val)
    {
        /* check what we have */
        const char *str = val->get_as_string(vmg0_);
        if (str != 0)
        {
            /* it's a string - show the first character */
            size_t len = vmb_get_len(str);
            str += VMB_LEN;
            if (len != 0)
            {
                /* write the first character */
                putwch(utf8_ptr::s_getch(str));
            }
            else
            {
                /* empty string - write a null character */
                putch((char)0);
            }
        }
        else
        {
            /* it's not a string - get the integer value */
            int i = val->cast_to_int(vmg0_);

            /* make sure it's in range */
            if (i < 0 || i > 65535)
                err_throw(VMERR_NUM_OVERFLOW);

            /* write the character value */
            putwch((wchar_t)i);
        }
    }